

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObject::setObjectName(QObject *this,QAnyStringView name)

{
  QObjectPrivate *this_00;
  ExtraData *pEVar1;
  qsizetype qVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  char16_t *pcVar4;
  bool bVar5;
  long in_FS_OFFSET;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_30;
  size_t local_28;
  long local_20;
  
  local_28 = name.m_size;
  local_30 = name.field_0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QObjectPrivate *)(this->d_ptr).d;
  QObjectPrivate::ensureExtraData(this_00);
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper(&this_00->extraData->objectName);
  pcStack_40 = (char16_t *)
               ((this_00->extraData->objectName).super_QPropertyData<QString>.val.d.size |
               0x8000000000000000);
  local_48 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
             (this_00->extraData->objectName).super_QPropertyData<QString>.val.d.ptr;
  bVar5 = ::operator!=((QAnyStringView *)&local_48,(QAnyStringView *)&local_30);
  if (bVar5) {
    pEVar1 = this_00->extraData;
    QAnyStringView::toString((QString *)&local_48,(QAnyStringView *)&local_30);
    aVar3 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
            (pEVar1->objectName).super_QPropertyData<QString>.val.d.d;
    pcVar4 = (pEVar1->objectName).super_QPropertyData<QString>.val.d.ptr;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.d = (Data *)local_48;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.ptr = pcStack_40;
    qVar2 = (pEVar1->objectName).super_QPropertyData<QString>.val.d.size;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.size = local_38;
    local_48 = aVar3;
    pcStack_40 = pcVar4;
    local_38 = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
    QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
    ::notify(&this_00->extraData->objectName);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObject::setObjectName(QAnyStringView name)
{
    Q_D(QObject);

    d->ensureExtraData();

    d->extraData->objectName.removeBindingUnlessInWrapper();

    if (d->extraData->objectName.valueBypassingBindings() != name) {
        d->extraData->objectName.setValueBypassingBindings(name.toString());
        d->extraData->objectName.notify(); // also emits a signal
    }
}